

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O3

State * __thiscall re2::DFA::WorkqToCachedState(DFA *this,Workq *q,Workq *mq,uint32_t flag)

{
  int iVar1;
  int iVar2;
  Prog *pPVar3;
  Inst *pIVar4;
  bool bVar5;
  MatchKind MVar6;
  long lVar7;
  int *inst;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  int *piVar11;
  State *pSVar12;
  uint ninst;
  long lVar13;
  byte bVar14;
  uint uVar15;
  uint uVar16;
  int *piVar17;
  uint uVar18;
  
  iVar1 = q->n_;
  lVar7 = (long)q->maxmark_ + (long)iVar1;
  uVar9 = 0xffffffffffffffff;
  if (-1 < (int)lVar7) {
    uVar9 = lVar7 * 4;
  }
  inst = (int *)operator_new__(uVar9);
  lVar7 = (long)(q->super_SparseSet).size_;
  if (lVar7 == 0) {
    uVar16 = flag & 0x100;
    ninst = 0;
    uVar15 = 0;
  }
  else {
    piVar17 = ((_Head_base<0UL,_int_*,_false> *)
              ((long)&(q->super_SparseSet).dense_.ptr_._M_t.
                      super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                      super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter> + 8))->_M_head_impl
    ;
    MVar6 = this->kind_;
    pPVar3 = this->prog_;
    lVar13 = 0;
    ninst = 0;
    uVar15 = 0;
    bVar14 = 0;
    bVar5 = false;
    do {
      iVar2 = *(int *)((long)piVar17 + lVar13);
      if (((bVar14 & 1) != 0) && (MVar6 == kFirstMatch || iVar1 <= iVar2)) break;
      if (iVar2 < iVar1) {
        pIVar4 = ((_Head_base<0UL,_re2::Prog::Inst_*,_false> *)
                 ((long)&(pPVar3->inst_).ptr_._M_t.
                         super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                 + 8))->_M_head_impl;
        uVar16 = pIVar4[iVar2].out_opcode_;
        if (((uVar16 & 7) == 1) && (MVar6 != kManyMatch)) {
          if (MVar6 == kLongestMatch) {
            if ((flag >> 8 & 1) != 0 && !bVar5) {
LAB_001b7ec4:
              pSVar12 = (State *)0x2;
              goto LAB_001b7eaa;
            }
          }
          else if (MVar6 == kFirstMatch) {
            if (lVar13 == 0) {
              uVar18 = pIVar4[uVar16 >> 4].out_opcode_ & 7;
              if (uVar18 == 2) goto LAB_001b7ca9;
              if (((uVar18 == 6) && ((flag >> 8 & 1) != 0)) &&
                 ((pIVar4[pIVar4[uVar16 >> 4].out_opcode_ >> 4].out_opcode_ & 7) == 2))
              goto LAB_001b7ec4;
            }
          }
          else {
LAB_001b7ca9:
            if ((flag >> 8 & 1) != 0) goto LAB_001b7ec4;
          }
        }
        if ((pIVar4[(long)iVar2 + -1].out_opcode_ & 8) != 0) {
          lVar10 = (long)(int)ninst;
          ninst = ninst + 1;
          inst[lVar10] = iVar2;
          uVar16 = pIVar4[iVar2].out_opcode_;
        }
        if ((uVar16 & 7) == 5) {
          bVar14 = bVar14 | pPVar3->anchor_end_ ^ 1U;
        }
        else if ((uVar16 & 7) == 4) {
          uVar15 = uVar15 | pIVar4[iVar2].field_1.out1_;
        }
      }
      else if ((0 < (int)ninst) && (inst[(ulong)ninst - 1] != -1)) {
        inst[ninst] = -1;
        bVar5 = true;
        ninst = ninst + 1;
      }
      lVar13 = lVar13 + 4;
    } while (lVar7 * 4 != lVar13);
    if (0 < (int)ninst) {
      ninst = ninst - (inst[(ulong)ninst - 1] == -1);
    }
    uVar16 = flag & 0x100;
    if (uVar15 != 0) {
      uVar16 = flag;
    }
    uVar15 = uVar15 << 0x10;
  }
  if (ninst == 0 && uVar16 == 0) {
    pSVar12 = (State *)0x1;
    goto LAB_001b7eaa;
  }
  MVar6 = this->kind_;
  uVar9 = (ulong)(int)ninst;
  if (MVar6 == kLongestMatch) {
    if (0 < (int)ninst) {
      piVar17 = inst;
      piVar11 = inst;
LAB_001b7d8f:
      do {
        iVar1 = *piVar17;
        if (iVar1 != -1) {
          piVar17 = piVar17 + 1;
          if (piVar17 < inst + uVar9) goto LAB_001b7d8f;
        }
        if (piVar11 != piVar17) {
          uVar8 = (long)piVar17 - (long)piVar11 >> 2;
          lVar7 = 0x3f;
          if (uVar8 != 0) {
            for (; uVar8 >> lVar7 == 0; lVar7 = lVar7 + -1) {
            }
          }
          std::__introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (piVar11,piVar17,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
          std::__final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(piVar11);
        }
        piVar17 = piVar17 + (iVar1 == -1);
        piVar11 = piVar17;
      } while (piVar17 < inst + uVar9);
      MVar6 = this->kind_;
      goto LAB_001b7df8;
    }
  }
  else {
LAB_001b7df8:
    if ((ninst != 0) && (MVar6 == kManyMatch)) {
      lVar7 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      std::__introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (inst,inst + uVar9,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
      std::__final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(inst);
    }
  }
  if (mq != (Workq *)0x0) {
    ninst = ninst + 1;
    inst[uVar9] = -2;
    lVar7 = (long)(mq->super_SparseSet).size_;
    if (lVar7 != 0) {
      piVar17 = ((_Head_base<0UL,_int_*,_false> *)
                ((long)&(mq->super_SparseSet).dense_.ptr_._M_t.
                        super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                        super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter> + 8))->
                _M_head_impl;
      pIVar4 = ((_Head_base<0UL,_re2::Prog::Inst_*,_false> *)
               ((long)&(this->prog_->inst_).ptr_._M_t.
                       super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                       ._M_t.
                       super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
               + 8))->_M_head_impl;
      lVar13 = 0;
      do {
        iVar1 = *(int *)((long)piVar17 + lVar13);
        if ((pIVar4[iVar1].out_opcode_ & 7) == 5) {
          lVar10 = (long)(int)ninst;
          ninst = ninst + 1;
          *(anon_union_4_5_a3ff96c3_for_Inst_2 *)(inst + lVar10) = pIVar4[iVar1].field_1;
        }
        lVar13 = lVar13 + 4;
      } while (lVar7 * 4 != lVar13);
    }
  }
  pSVar12 = CachedState(this,inst,ninst,uVar16 | uVar15);
LAB_001b7eaa:
  operator_delete__(inst);
  return pSVar12;
}

Assistant:

DFA::State* DFA::WorkqToCachedState(Workq* q, Workq* mq, uint32_t flag) {
  //mutex_.AssertHeld();

  // Construct array of instruction ids for the new state.
  // Only ByteRange, EmptyWidth, and Match instructions are useful to keep:
  // those are the only operators with any effect in
  // RunWorkqOnEmptyString or RunWorkqOnByte.
  int* inst = new int[q->size()];
  int n = 0;
  uint32_t needflags = 0;  // flags needed by kInstEmptyWidth instructions
  bool sawmatch = false;   // whether queue contains guaranteed kInstMatch
  bool sawmark = false;    // whether queue contains a Mark
  if (ExtraDebug)
    fprintf(stderr, "WorkqToCachedState %s [%#x]", DumpWorkq(q).c_str(), flag);
  for (Workq::iterator it = q->begin(); it != q->end(); ++it) {
    int id = *it;
    if (sawmatch && (kind_ == Prog::kFirstMatch || q->is_mark(id)))
      break;
    if (q->is_mark(id)) {
      if (n > 0 && inst[n-1] != Mark) {
        sawmark = true;
        inst[n++] = Mark;
      }
      continue;
    }
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
      case kInstAltMatch:
        // This state will continue to a match no matter what
        // the rest of the input is.  If it is the highest priority match
        // being considered, return the special FullMatchState
        // to indicate that it's all matches from here out.
        if (kind_ != Prog::kManyMatch &&
            (kind_ != Prog::kFirstMatch ||
             (it == q->begin() && ip->greedy(prog_))) &&
            (kind_ != Prog::kLongestMatch || !sawmark) &&
            (flag & kFlagMatch)) {
          delete[] inst;
          if (ExtraDebug)
            fprintf(stderr, " -> FullMatchState\n");
          return FullMatchState;
        }
        FALLTHROUGH_INTENDED;
      default:
        // Record iff id is the head of its list, which must
        // be the case if id-1 is the last of *its* list. :)
        if (prog_->inst(id-1)->last())
          inst[n++] = *it;
        if (ip->opcode() == kInstEmptyWidth)
          needflags |= ip->empty();
        if (ip->opcode() == kInstMatch && !prog_->anchor_end())
          sawmatch = true;
        break;
    }
  }
  DCHECK_LE(n, q->size());
  if (n > 0 && inst[n-1] == Mark)
    n--;

  // If there are no empty-width instructions waiting to execute,
  // then the extra flag bits will not be used, so there is no
  // point in saving them.  (Discarding them reduces the number
  // of distinct states.)
  if (needflags == 0)
    flag &= kFlagMatch;

  // NOTE(rsc): The code above cannot do flag &= needflags,
  // because if the right flags were present to pass the current
  // kInstEmptyWidth instructions, new kInstEmptyWidth instructions
  // might be reached that in turn need different flags.
  // The only sure thing is that if there are no kInstEmptyWidth
  // instructions at all, no flags will be needed.
  // We could do the extra work to figure out the full set of
  // possibly needed flags by exploring past the kInstEmptyWidth
  // instructions, but the check above -- are any flags needed
  // at all? -- handles the most common case.  More fine-grained
  // analysis can only be justified by measurements showing that
  // too many redundant states are being allocated.

  // If there are no Insts in the list, it's a dead state,
  // which is useful to signal with a special pointer so that
  // the execution loop can stop early.  This is only okay
  // if the state is *not* a matching state.
  if (n == 0 && flag == 0) {
    delete[] inst;
    if (ExtraDebug)
      fprintf(stderr, " -> DeadState\n");
    return DeadState;
  }

  // If we're in longest match mode, the state is a sequence of
  // unordered state sets separated by Marks.  Sort each set
  // to canonicalize, to reduce the number of distinct sets stored.
  if (kind_ == Prog::kLongestMatch) {
    int* ip = inst;
    int* ep = ip + n;
    while (ip < ep) {
      int* markp = ip;
      while (markp < ep && *markp != Mark)
        markp++;
      std::sort(ip, markp);
      if (markp < ep)
        markp++;
      ip = markp;
    }
  }

  // If we're in many match mode, canonicalize for similar reasons:
  // we have an unordered set of states (i.e. we don't have Marks)
  // and sorting will reduce the number of distinct sets stored.
  if (kind_ == Prog::kManyMatch) {
    int* ip = inst;
    int* ep = ip + n;
    std::sort(ip, ep);
  }

  // Append MatchSep and the match IDs in mq if necessary.
  if (mq != NULL) {
    inst[n++] = MatchSep;
    for (Workq::iterator i = mq->begin(); i != mq->end(); ++i) {
      int id = *i;
      Prog::Inst* ip = prog_->inst(id);
      if (ip->opcode() == kInstMatch)
        inst[n++] = ip->match_id();
    }
  }

  // Save the needed empty-width flags in the top bits for use later.
  flag |= needflags << kFlagNeedShift;

  State* state = CachedState(inst, n, flag);
  delete[] inst;
  return state;
}